

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O3

ggml_tensor *
map_tensor(map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
           *tensor_map,ggml_context *ctx,ggml_tensor *tensor)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Base_ptr p_Var9;
  ggml_tensor *pgVar10;
  mapped_type *ppgVar11;
  long lVar12;
  ggml_tensor *pgVar13;
  _Base_ptr p_Var14;
  ggml_tensor *local_28;
  
  if (tensor == (ggml_tensor *)0x0) {
    pgVar10 = (ggml_tensor *)0x0;
  }
  else {
    p_Var9 = (tensor_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_28 = tensor;
    if (p_Var9 != (_Base_ptr)0x0) {
      p_Var1 = &(tensor_map->_M_t)._M_impl.super__Rb_tree_header;
      p_Var14 = &p_Var1->_M_header;
      do {
        if (*(ggml_tensor **)(p_Var9 + 1) >= tensor) {
          p_Var14 = p_Var9;
        }
        p_Var9 = (&p_Var9->_M_left)[*(ggml_tensor **)(p_Var9 + 1) < tensor];
      } while (p_Var9 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var14 != p_Var1) && (*(ggml_tensor **)(p_Var14 + 1) <= tensor)) {
        ppgVar11 = std::
                   map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                   ::operator[](tensor_map,&local_28);
        return *ppgVar11;
      }
    }
    pgVar10 = ggml_dup_tensor(ctx,tensor);
    ppgVar11 = std::
               map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
               ::operator[](tensor_map,&local_28);
    pgVar13 = local_28;
    *ppgVar11 = pgVar10;
    pgVar10->op = local_28->op;
    lVar12 = 6;
    do {
      pgVar10->ne[lVar12 + -2] = local_28->ne[lVar12 + -2];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    pgVar10->flags = local_28->flags;
    uVar2 = *(undefined8 *)(local_28->op_params + 2);
    uVar3 = *(undefined8 *)(local_28->op_params + 4);
    uVar4 = *(undefined8 *)(local_28->op_params + 6);
    uVar5 = *(undefined8 *)(local_28->op_params + 8);
    uVar6 = *(undefined8 *)(local_28->op_params + 10);
    uVar7 = *(undefined8 *)(local_28->op_params + 0xc);
    uVar8 = *(undefined8 *)(local_28->op_params + 0xe);
    *(undefined8 *)pgVar10->op_params = *(undefined8 *)local_28->op_params;
    *(undefined8 *)(pgVar10->op_params + 2) = uVar2;
    *(undefined8 *)(pgVar10->op_params + 4) = uVar3;
    *(undefined8 *)(pgVar10->op_params + 6) = uVar4;
    *(undefined8 *)(pgVar10->op_params + 8) = uVar5;
    *(undefined8 *)(pgVar10->op_params + 10) = uVar6;
    *(undefined8 *)(pgVar10->op_params + 0xc) = uVar7;
    *(undefined8 *)(pgVar10->op_params + 0xe) = uVar8;
    strcpy(pgVar10->name,local_28->name);
    pgVar10->data = pgVar13->data;
    pgVar10->buffer = pgVar13->buffer;
    pgVar10->extra = pgVar13->extra;
    pgVar10->view_offs = pgVar13->view_offs;
    pgVar13 = map_tensor(tensor_map,ctx,pgVar13->view_src);
    pgVar10->view_src = pgVar13;
    lVar12 = 0x13;
    do {
      pgVar13 = map_tensor(tensor_map,ctx,(ggml_tensor *)local_28->ne[lVar12 + -2]);
      pgVar10->ne[lVar12 + -2] = (int64_t)pgVar13;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x1d);
  }
  return pgVar10;
}

Assistant:

static ggml_tensor * map_tensor(std::map<ggml_tensor *, ggml_tensor *> & tensor_map, ggml_context * ctx, ggml_tensor * tensor) {
    if (!tensor) {
        return nullptr;
    }

    if (tensor_map.find(tensor) != tensor_map.end()) {
        return tensor_map[tensor];
    }

    ggml_tensor * new_tensor = ggml_dup_tensor(ctx, tensor);
    tensor_map[tensor] = new_tensor;

    new_tensor->op = tensor->op;
    for (int i = 0; i < GGML_MAX_DIMS; i++) {
        new_tensor->nb[i] = tensor->nb[i];
    }
    new_tensor->flags = tensor->flags;
    memcpy(new_tensor->op_params, tensor->op_params, sizeof(tensor->op_params));
    strcpy(new_tensor->name, tensor->name);
    new_tensor->data = tensor->data;
    new_tensor->buffer = tensor->buffer;
    new_tensor->extra = tensor->extra;
    new_tensor->view_offs = tensor->view_offs;
    new_tensor->view_src = map_tensor(tensor_map, ctx, tensor->view_src);
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        new_tensor->src[i] = map_tensor(tensor_map, ctx, tensor->src[i]);
    }

    return new_tensor;
}